

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sunmatrix_sparse.c
# Opt level: O0

SUNErrCode SUNMatScaleAddI_Sparse(sunrealtype c,SUNMatrix A)

{
  long lVar1;
  long lVar2;
  long lVar3;
  long lVar4;
  long lVar5;
  bool bVar6;
  void *pvVar7;
  void *__ptr;
  SUNMatrix p_Var8;
  long *in_RDI;
  double in_XMM0_Qa;
  SUNContext sunctx_local_scope_;
  SUNMatrix C;
  sunrealtype *Cx;
  sunrealtype *Ax;
  sunrealtype *x;
  sunindextype *Ci;
  sunindextype *Cp;
  sunindextype *Ai;
  sunindextype *Ap;
  sunindextype *w;
  int found;
  int newmat;
  sunindextype nw;
  sunindextype cend;
  sunindextype N;
  sunindextype M;
  sunindextype newvals;
  sunindextype nz;
  sunindextype p;
  sunindextype i;
  sunindextype j;
  SUNContext local_d0;
  SUNContext sunctx;
  long lVar9;
  sunindextype in_stack_ffffffffffffff58;
  sunindextype in_stack_ffffffffffffff60;
  long local_50;
  SUNContext local_48;
  SUNContext local_40;
  long local_38;
  long local_30;
  long local_28;
  long local_20;
  undefined1 *local_18;
  
  lVar9 = in_RDI[2];
  if (*(int *)(*in_RDI + 0x28) == 0) {
    local_40 = *(SUNContext *)*in_RDI;
    local_48 = *(SUNContext *)(*in_RDI + 8);
  }
  else {
    local_40 = *(SUNContext *)(*in_RDI + 8);
    local_48 = *(SUNContext *)*in_RDI;
  }
  lVar1 = *(long *)(*in_RDI + 0x38);
  lVar2 = *(long *)(*in_RDI + 0x30);
  lVar3 = *(long *)(*in_RDI + 0x20);
  local_38 = 0;
  local_18 = (undefined1 *)0x0;
  do {
    sunctx = local_48;
    if ((long)local_40 < (long)local_48) {
      sunctx = local_40;
    }
    if ((long)sunctx <= (long)local_18) {
      if (local_38 == 0) {
        local_18 = (undefined1 *)0x0;
        while( true ) {
          if ((long)local_40 < (long)local_48) {
            local_d0 = local_40;
          }
          else {
            local_d0 = local_48;
          }
          if ((long)local_d0 <= (long)local_18) break;
          for (local_20 = *(long *)(lVar1 + (long)local_18 * 8);
              local_20 < *(long *)(lVar1 + 8 + (long)local_18 * 8); local_20 = local_20 + 1) {
            if ((undefined1 *)*(long *)(lVar2 + local_20 * 8) == local_18) {
              *(double *)(lVar3 + local_20 * 8) =
                   in_XMM0_Qa * *(double *)(lVar3 + local_20 * 8) + 1.0;
            }
            else {
              *(double *)(lVar3 + local_20 * 8) = in_XMM0_Qa * *(double *)(lVar3 + local_20 * 8);
            }
          }
          local_18 = (undefined1 *)((long)local_18 + 1);
        }
      }
      else if (*(long *)(*in_RDI + 0x10) - *(long *)(lVar1 + (long)local_48 * 8) < local_38) {
        pvVar7 = malloc((long)local_40 << 3);
        p_Var8 = SUNSparseMatrix(in_stack_ffffffffffffff60,in_stack_ffffffffffffff58,lVar9,
                                 (int)((ulong)local_18 >> 0x20),sunctx);
        lVar9 = *(long *)((long)p_Var8->content + 0x38);
        lVar4 = *(long *)((long)p_Var8->content + 0x30);
        lVar5 = *(long *)((long)p_Var8->content + 0x20);
        local_30 = 0;
        for (local_18 = (undefined1 *)0x0; (long)local_18 < (long)local_48;
            local_18 = (undefined1 *)((long)local_18 + 1)) {
          *(long *)(lVar9 + (long)local_18 * 8) = local_30;
          *(undefined8 *)((long)pvVar7 + (long)local_18 * 8) = 0;
          for (local_28 = *(long *)(lVar1 + (long)local_18 * 8);
              local_28 < *(long *)(lVar1 + 8 + (long)local_18 * 8); local_28 = local_28 + 1) {
            *(double *)((long)pvVar7 + *(long *)(lVar2 + local_28 * 8) * 8) =
                 in_XMM0_Qa * *(double *)(lVar3 + local_28 * 8);
          }
          if ((long)local_18 < (long)local_40) {
            *(double *)((long)pvVar7 + (long)local_18 * 8) =
                 *(double *)((long)pvVar7 + (long)local_18 * 8) + 1.0;
          }
          local_28 = *(long *)(lVar1 + (long)local_18 * 8);
          while( true ) {
            bVar6 = false;
            if (local_28 < *(long *)(lVar1 + 8 + (long)local_18 * 8)) {
              bVar6 = *(long *)(lVar2 + local_28 * 8) < (long)local_18;
            }
            if (!bVar6) break;
            *(undefined8 *)(lVar4 + local_30 * 8) = *(undefined8 *)(lVar2 + local_28 * 8);
            *(undefined8 *)(lVar5 + local_30 * 8) =
                 *(undefined8 *)((long)pvVar7 + *(long *)(lVar2 + local_28 * 8) * 8);
            local_28 = local_28 + 1;
            local_30 = local_30 + 1;
          }
          if ((*(long *)(lVar1 + 8 + (long)local_18 * 8) <= local_28) ||
             ((undefined1 *)*(long *)(lVar2 + local_28 * 8) != local_18)) {
            *(undefined1 **)(lVar4 + local_30 * 8) = local_18;
            *(undefined8 *)(lVar5 + local_30 * 8) =
                 *(undefined8 *)((long)pvVar7 + (long)local_18 * 8);
            local_30 = local_30 + 1;
          }
          for (; local_28 < *(long *)(lVar1 + 8 + (long)local_18 * 8); local_28 = local_28 + 1) {
            *(undefined8 *)(lVar4 + local_30 * 8) = *(undefined8 *)(lVar2 + local_28 * 8);
            *(undefined8 *)(lVar5 + local_30 * 8) =
                 *(undefined8 *)((long)pvVar7 + *(long *)(lVar2 + local_28 * 8) * 8);
            local_30 = local_30 + 1;
          }
        }
        *(long *)(lVar9 + (long)local_48 * 8) = local_30;
        *(undefined8 *)(*in_RDI + 0x10) = *(undefined8 *)((long)p_Var8->content + 0x10);
        if (*(long *)(*in_RDI + 0x20) != 0) {
          free(*(void **)(*in_RDI + 0x20));
        }
        *(undefined8 *)(*in_RDI + 0x20) = *(undefined8 *)((long)p_Var8->content + 0x20);
        *(undefined8 *)((long)p_Var8->content + 0x20) = 0;
        if (*(long *)(*in_RDI + 0x30) != 0) {
          free(*(void **)(*in_RDI + 0x30));
        }
        *(undefined8 *)(*in_RDI + 0x30) = *(undefined8 *)((long)p_Var8->content + 0x30);
        *(undefined8 *)((long)p_Var8->content + 0x30) = 0;
        if (*(long *)(*in_RDI + 0x38) != 0) {
          free(*(void **)(*in_RDI + 0x38));
        }
        *(undefined8 *)(*in_RDI + 0x38) = *(undefined8 *)((long)p_Var8->content + 0x38);
        *(undefined8 *)((long)p_Var8->content + 0x38) = 0;
        SUNMatDestroy_Sparse((SUNMatrix)0x14e144);
        free(pvVar7);
      }
      else {
        pvVar7 = malloc((long)local_40 << 3);
        __ptr = malloc((long)local_40 << 3);
        local_30 = *(long *)(lVar1 + (long)local_48 * 8) + local_38;
        local_50 = *(long *)(lVar1 + (long)local_48 * 8);
        *(long *)(lVar1 + (long)local_48 * 8) = local_30;
        while (local_18 = &local_48[-1].field_0x2f, -1 < (long)local_18) {
          *(undefined8 *)((long)__ptr + (long)local_18 * 8) = 0;
          local_28 = *(long *)(lVar1 + (long)local_18 * 8);
          local_20 = 0;
          for (; local_28 < local_50; local_28 = local_28 + 1) {
            *(undefined8 *)((long)pvVar7 + local_20 * 8) = *(undefined8 *)(lVar2 + local_28 * 8);
            *(double *)((long)__ptr + *(long *)(lVar2 + local_28 * 8) * 8) =
                 in_XMM0_Qa * *(double *)(lVar3 + local_28 * 8);
            local_20 = local_20 + 1;
          }
          local_20 = local_50 - *(long *)(lVar1 + (long)local_18 * 8);
          if ((long)local_18 < (long)local_40) {
            *(double *)((long)__ptr + (long)local_18 * 8) =
                 *(double *)((long)__ptr + (long)local_18 * 8) + 1.0;
          }
          while( true ) {
            local_20 = local_20 + -1;
            bVar6 = false;
            if (-1 < local_20) {
              bVar6 = (long)local_18 < *(long *)((long)pvVar7 + local_20 * 8);
            }
            if (!bVar6) break;
            *(undefined8 *)(lVar2 + -8 + local_30 * 8) =
                 *(undefined8 *)((long)pvVar7 + local_20 * 8);
            *(undefined8 *)(lVar3 + (local_30 + -1) * 8) =
                 *(undefined8 *)((long)__ptr + *(long *)((long)pvVar7 + local_20 * 8) * 8);
            local_30 = local_30 + -1;
          }
          if ((local_20 < 0) || (*(undefined1 **)((long)pvVar7 + local_20 * 8) != local_18)) {
            *(undefined1 **)(lVar2 + -8 + local_30 * 8) = local_18;
            *(undefined8 *)(lVar3 + (local_30 + -1) * 8) =
                 *(undefined8 *)((long)__ptr + (long)local_18 * 8);
            local_30 = local_30 + -1;
          }
          for (; -1 < local_20; local_20 = local_20 + -1) {
            *(undefined8 *)(lVar2 + -8 + local_30 * 8) =
                 *(undefined8 *)((long)pvVar7 + local_20 * 8);
            *(undefined8 *)(lVar3 + (local_30 + -1) * 8) =
                 *(undefined8 *)((long)__ptr + *(long *)((long)pvVar7 + local_20 * 8) * 8);
            local_30 = local_30 + -1;
          }
          local_50 = *(long *)(lVar1 + (long)local_18 * 8);
          *(long *)(lVar1 + (long)local_18 * 8) = local_30;
          local_48 = (SUNContext)local_18;
        }
        free(pvVar7);
        free(__ptr);
      }
      return 0;
    }
    bVar6 = false;
    for (local_20 = *(long *)(lVar1 + (long)local_18 * 8);
        local_20 < *(long *)(lVar1 + 8 + (long)local_18 * 8); local_20 = local_20 + 1) {
      if ((undefined1 *)*(long *)(lVar2 + local_20 * 8) == local_18) {
        bVar6 = true;
        break;
      }
    }
    if (!bVar6) {
      local_38 = local_38 + 1;
    }
    local_18 = (undefined1 *)((long)local_18 + 1);
  } while( true );
}

Assistant:

SUNErrCode SUNMatScaleAddI_Sparse(sunrealtype c, SUNMatrix A)
{
  sunindextype j, i, p, nz, newvals, M, N, cend, nw;
  sunbooleantype newmat, found;
  sunindextype *w, *Ap, *Ai, *Cp, *Ci;
  sunrealtype *x, *Ax, *Cx;
  SUNMatrix C;
  SUNFunctionBegin(A->sunctx);

  /* store shortcuts to matrix dimensions (M is inner dimension, N is outer) */
  if (SM_SPARSETYPE_S(A) == CSC_MAT)
  {
    M = SM_ROWS_S(A);
    N = SM_COLUMNS_S(A);
  }
  else
  {
    M = SM_COLUMNS_S(A);
    N = SM_ROWS_S(A);
  }

  /* access data arrays from A */
  Ap = NULL;
  Ai = NULL;
  Ax = NULL;
  Ap = SM_INDEXPTRS_S(A);
  SUNAssert(Ap, SUN_ERR_ARG_CORRUPT);
  Ai = SM_INDEXVALS_S(A);
  SUNAssert(Ai, SUN_ERR_ARG_CORRUPT);
  Ax = SM_DATA_S(A);
  SUNAssert(Ax, SUN_ERR_ARG_CORRUPT);

  /* determine if A: contains values on the diagonal (so I can just be added
     in); if not, then increment counter for extra storage that should be
     required. */
  newvals = 0;
  for (j = 0; j < SUNMIN(M, N); j++)
  {
    /* scan column (row if CSR) of A, searching for diagonal value */
    found = SUNFALSE;
    for (i = Ap[j]; i < Ap[j + 1]; i++)
    {
      if (Ai[i] == j)
      {
        found = SUNTRUE;
        break;
      }
    }
    /* if no diagonal found, increment necessary storage counter */
    if (!found) { newvals += 1; }
  }

  /* If extra nonzeros required, check whether matrix has sufficient storage
     space for new nonzero entries  (so I can be inserted into existing storage)
   */
  newmat = SUNFALSE; /* no reallocation needed */
  if (newvals > (SM_NNZ_S(A) - Ap[N])) { newmat = SUNTRUE; }

  /* perform operation based on existing/necessary structure */

  /*   case 1: A already contains a diagonal */
  if (newvals == 0)
  {
    /* iterate through columns, adding 1.0 to diagonal */
    for (j = 0; j < SUNMIN(M, N); j++)
    {
      for (i = Ap[j]; i < Ap[j + 1]; i++)
      {
        if (Ai[i] == j) { Ax[i] = ONE + c * Ax[i]; }
        else { Ax[i] = c * Ax[i]; }
      }
    }

    /*   case 2: A has sufficient storage, but does not already contain a
     * diagonal */
  }
  else if (!newmat)
  {
    /* create work arrays for nonzero row (column) indices and values in a
     * single column (row) */
    w = (sunindextype*)malloc(M * sizeof(sunindextype));
    SUNAssert(w, SUN_ERR_MALLOC_FAIL);
    x = (sunrealtype*)malloc(M * sizeof(sunrealtype));
    SUNAssert(x, SUN_ERR_MALLOC_FAIL);

    /* determine storage location where last column (row) should end */
    nz = Ap[N] + newvals;

    /* store pointer past last column (row) from original A,
       and store updated value in revised A */
    cend  = Ap[N];
    Ap[N] = nz;

    /* iterate through columns (rows) backwards */
    for (j = N - 1; j >= 0; j--)
    {
      /* reset diagonal entry, in case it's not in A */
      x[j] = ZERO;

      /* iterate down column (row) of A, collecting nonzeros */
      for (p = Ap[j], i = 0; p < cend; p++, i++)
      {
        w[i]     = Ai[p];     /* collect row (column) index */
        x[Ai[p]] = c * Ax[p]; /* collect/scale value */
      }

      /* NNZ in this column (row) */
      nw = cend - Ap[j];

      /* add identity to this column (row) */
      if (j < M) { x[j] += ONE; /* update value */ }

      /* fill entries of A with this column's (row's) data */
      /* fill entries past diagonal */
      for (i = nw - 1; i >= 0 && w[i] > j; i--)
      {
        Ai[--nz] = w[i];
        Ax[nz]   = x[w[i]];
      }
      /* fill diagonal if applicable */
      if (i < 0 /* empty or insert at front */ ||
          w[i] != j /* insert behind front */)
      {
        Ai[--nz] = j;
        Ax[nz]   = x[j];
      }
      /* fill entries before diagonal */
      for (; i >= 0; i--)
      {
        Ai[--nz] = w[i];
        Ax[nz]   = x[w[i]];
      }

      /* store ptr past this col (row) from orig A, update value for new A */
      cend  = Ap[j];
      Ap[j] = nz;
    }

    /* clean up */
    free(w);
    free(x);

    /*   case 3: A must be reallocated with sufficient storage */
  }
  else
  {
    /* create work array for nonzero values in a single column (row) */
    x = (sunrealtype*)malloc(M * sizeof(sunrealtype));

    /* create new matrix for sum */
    C = SUNSparseMatrix(SM_ROWS_S(A), SM_COLUMNS_S(A), Ap[N] + newvals,
                        SM_SPARSETYPE_S(A), A->sunctx);
    SUNCheckLastErr();

    /* access data from CSR structures (return if failure) */
    Cp = NULL;
    Ci = NULL;
    Cx = NULL;
    Cp = SM_INDEXPTRS_S(C);
    SUNAssert(Cp, SUN_ERR_ARG_CORRUPT);
    Ci = SM_INDEXVALS_S(C);
    SUNAssert(Ci, SUN_ERR_ARG_CORRUPT);
    Cx = SM_DATA_S(C);
    SUNAssert(Cx, SUN_ERR_ARG_CORRUPT);

    /* initialize total nonzero count */
    nz = 0;

    /* iterate through columns (rows for CSR) */
    for (j = 0; j < N; j++)
    {
      /* set current column (row) pointer to current # nonzeros */
      Cp[j] = nz;

      /* reset diagonal entry, in case it's not in A */
      x[j] = ZERO;

      /* iterate down column (along row) of A, collecting nonzeros */
      for (p = Ap[j]; p < Ap[j + 1]; p++)
      {
        x[Ai[p]] = c * Ax[p]; /* collect/scale value */
      }

      /* add identity to this column (row) */
      if (j < M) { x[j] += ONE; /* update value */ }

      /* fill entries of C with this column's (row's) data */
      /* fill entries before diagonal */
      for (p = Ap[j]; p < Ap[j + 1] && Ai[p] < j; p++)
      {
        Ci[nz]   = Ai[p];
        Cx[nz++] = x[Ai[p]];
      }
      /* fill diagonal if applicable */
      if (p >= Ap[j + 1] /* empty or insert at end */ ||
          Ai[p] != j /* insert before end */)
      {
        Ci[nz]   = j;
        Cx[nz++] = x[j];
      }
      /* fill entries past diagonal */
      for (; p < Ap[j + 1]; p++)
      {
        Ci[nz]   = Ai[p];
        Cx[nz++] = x[Ai[p]];
      }
    }

    /* indicate end of data */
    Cp[N] = nz;

    /* update A's structure with C's values; nullify C's pointers */
    SM_NNZ_S(A) = SM_NNZ_S(C);

    if (SM_DATA_S(A)) { free(SM_DATA_S(A)); }
    SM_DATA_S(A) = SM_DATA_S(C);
    SM_DATA_S(C) = NULL;

    if (SM_INDEXVALS_S(A)) { free(SM_INDEXVALS_S(A)); }
    SM_INDEXVALS_S(A) = SM_INDEXVALS_S(C);
    SM_INDEXVALS_S(C) = NULL;

    if (SM_INDEXPTRS_S(A)) { free(SM_INDEXPTRS_S(A)); }
    SM_INDEXPTRS_S(A) = SM_INDEXPTRS_S(C);
    SM_INDEXPTRS_S(C) = NULL;

    /* clean up */
    SUNMatDestroy_Sparse(C);
    free(x);
  }
  return SUN_SUCCESS;
}